

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O3

char * cbor_print_bytes_part(char *out,char *out_max,uint8_t *in,int64_t val)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  
  if (out + 1 < out_max && 0 < val) {
    lVar4 = 1;
    do {
      bVar2 = in[lVar4 + -1];
      cVar5 = (bVar2 >> 4) + 0x57;
      if (bVar2 < 0xa0) {
        cVar5 = (bVar2 >> 4) + 0x30;
      }
      bVar2 = bVar2 & 0xf;
      cVar6 = bVar2 + 0x57;
      if (bVar2 < 10) {
        cVar6 = bVar2 + 0x30;
      }
      *out = cVar5;
      pcVar1 = out + 2;
      out[1] = cVar6;
    } while ((lVar4 < val) && (pcVar3 = out + 3, lVar4 = lVar4 + 1, out = pcVar1, pcVar3 < out_max))
    ;
    return pcVar1;
  }
  return out;
}

Assistant:

char* cbor_print_bytes_part(char* out, char const* out_max, uint8_t* in, int64_t val)
{
    for (int64_t i = 0; i < val && out + 1 < out_max; i++) {
        int c = in[i];
        *out++ = hex_to_char(c >> 4);
		*out++ = hex_to_char(c);
    }

    return out;
}